

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCommandArgumentParserHelper.cxx
# Opt level: O0

void __thiscall cmCommandArgumentParserHelper::CleanupParser(cmCommandArgumentParserHelper *this)

{
  bool bVar1;
  reference ppcVar2;
  __normal_iterator<char_**,_std::vector<char_*,_std::allocator<char_*>_>_> local_50;
  const_iterator local_48;
  __normal_iterator<char_**,_std::vector<char_*,_std::allocator<char_*>_>_> local_40;
  const_iterator local_38;
  char *local_30;
  char *var;
  iterator __end1;
  iterator __begin1;
  vector<char_*,_std::allocator<char_*>_> *__range1;
  cmCommandArgumentParserHelper *this_local;
  
  __end1 = std::vector<char_*,_std::allocator<char_*>_>::begin(&this->Variables);
  var = (char *)std::vector<char_*,_std::allocator<char_*>_>::end(&this->Variables);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<char_**,_std::vector<char_*,_std::allocator<char_*>_>_>
                                *)&var);
    if (!bVar1) break;
    ppcVar2 = __gnu_cxx::__normal_iterator<char_**,_std::vector<char_*,_std::allocator<char_*>_>_>::
              operator*(&__end1);
    local_30 = *ppcVar2;
    if (local_30 != (char *)0x0) {
      operator_delete__(local_30);
    }
    __gnu_cxx::__normal_iterator<char_**,_std::vector<char_*,_std::allocator<char_*>_>_>::operator++
              (&__end1);
  }
  local_40._M_current =
       (char **)std::vector<char_*,_std::allocator<char_*>_>::begin(&this->Variables);
  __gnu_cxx::__normal_iterator<char*const*,std::vector<char*,std::allocator<char*>>>::
  __normal_iterator<char**>
            ((__normal_iterator<char*const*,std::vector<char*,std::allocator<char*>>> *)&local_38,
             &local_40);
  local_50._M_current = (char **)std::vector<char_*,_std::allocator<char_*>_>::end(&this->Variables)
  ;
  __gnu_cxx::__normal_iterator<char*const*,std::vector<char*,std::allocator<char*>>>::
  __normal_iterator<char**>
            ((__normal_iterator<char*const*,std::vector<char*,std::allocator<char*>>> *)&local_48,
             &local_50);
  std::vector<char_*,_std::allocator<char_*>_>::erase(&this->Variables,local_38,local_48);
  return;
}

Assistant:

void cmCommandArgumentParserHelper::CleanupParser()
{
  for (char* var : this->Variables) {
    delete[] var;
  }
  this->Variables.erase(this->Variables.begin(), this->Variables.end());
}